

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void deserialize_node<char_const*>(IsoTree *node,char **in)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  byte *pbVar4;
  char *pcVar5;
  size_t sVar6;
  size_t n_els;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  size_t sVar11;
  size_t sVar12;
  
  if (interrupt_switch) {
    return;
  }
  pbVar4 = (byte *)*in;
  bVar3 = *pbVar4;
  *in = (char *)(pbVar4 + 1);
  node->col_type = (uint)bVar3;
  node->chosen_cat = *(int *)(pbVar4 + 1);
  pcVar5 = *in;
  *in = pcVar5 + 4;
  dVar1 = *(double *)(pcVar5 + 4);
  dVar2 = *(double *)(pcVar5 + 0x2c);
  dVar7 = *(double *)(pcVar5 + 0xc);
  dVar8 = *(double *)(pcVar5 + 0x14);
  dVar9 = *(double *)(pcVar5 + 0x1c);
  dVar10 = *(double *)(pcVar5 + 0x24);
  *in = pcVar5 + 0x34;
  node->num_split = dVar1;
  node->pct_tree_left = dVar7;
  node->score = dVar8;
  node->range_low = dVar9;
  node->range_high = dVar10;
  node->remainder = dVar2;
  sVar6 = *(size_t *)(pcVar5 + 0x34);
  n_els = *(size_t *)(pcVar5 + 0x4c);
  sVar11 = *(size_t *)(pcVar5 + 0x3c);
  sVar12 = *(size_t *)(pcVar5 + 0x44);
  *in = pcVar5 + 0x54;
  node->col_num = sVar6;
  node->tree_left = sVar11;
  node->tree_right = sVar12;
  read_bytes<signed_char>(&node->cat_split,n_els,in);
  return;
}

Assistant:

void deserialize_node(IsoTree &node, itype &in)
{
    if (interrupt_switch) return;

    uint8_t data_en;
    read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
    node.col_type = (ColType)data_en;

    read_bytes<int>((void*)&node.chosen_cat, (size_t)1, in);

    double data_doubles[6];
    read_bytes<double>((void*)data_doubles, (size_t)6, in);
    node.num_split = data_doubles[0];
    node.pct_tree_left = data_doubles[1];
    node.score = data_doubles[2];
    node.range_low = data_doubles[3];
    node.range_high = data_doubles[4];
    node.remainder = data_doubles[5];

    size_t data_sizets[4];
    read_bytes<size_t>((void*)data_sizets, (size_t)4, in);
    node.col_num = data_sizets[0];
    node.tree_left = data_sizets[1];
    node.tree_right = data_sizets[2];
    read_bytes<signed char>(node.cat_split, data_sizets[3], in);
}